

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O1

void __thiscall QDBusPlatformMenu::syncSubMenu(QDBusPlatformMenu *this,QDBusPlatformMenu *menu)

{
  undefined4 *puVar1;
  long in_FS_OFFSET;
  QObject local_70 [8];
  QObject local_68 [8];
  code *local_60;
  ImplFn local_58;
  QObject local_50 [8];
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = propertiesUpdated;
  local_58 = (ImplFn)0x0;
  local_48 = propertiesUpdated;
  local_40 = 0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::
       QCallableObject<void_(QDBusPlatformMenu::*)(QList<QDBusMenuItem>,_QList<QDBusMenuItemKeys>),_QtPrivate::List<QList<QDBusMenuItem>,_QList<QDBusMenuItemKeys>_>,_void>
       ::impl;
  *(code **)(puVar1 + 4) = propertiesUpdated;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)menu,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)&local_60,
             (ConnectionType)puVar1,(int *)0x80,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_60 = updated;
  local_58 = (ImplFn)0x0;
  local_48 = updated;
  local_40 = 0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::
       QCallableObject<void_(QDBusPlatformMenu::*)(unsigned_int,_int),_QtPrivate::List<unsigned_int,_int>,_void>
       ::impl;
  *(code **)(puVar1 + 4) = updated;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)menu,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)&local_60,
             (ConnectionType)puVar1,(int *)0x80,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  local_60 = popupRequested;
  local_58 = (ImplFn)0x0;
  local_48 = popupRequested;
  local_40 = 0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::
       QCallableObject<void_(QDBusPlatformMenu::*)(int,_unsigned_int),_QtPrivate::List<int,_unsigned_int>,_void>
       ::impl;
  *(code **)(puVar1 + 4) = popupRequested;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)menu,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)&local_60,
             (ConnectionType)puVar1,(int *)0x80,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::syncSubMenu(const QDBusPlatformMenu *menu)
{
    // The adaptor is only connected to the propertiesUpdated signal of the top-level
    // menu, so the submenus should transfer their signals to their parents.
    connect(menu, &QDBusPlatformMenu::propertiesUpdated,
            this, &QDBusPlatformMenu::propertiesUpdated, Qt::UniqueConnection);
    connect(menu, &QDBusPlatformMenu::updated,
            this, &QDBusPlatformMenu::updated, Qt::UniqueConnection);
    connect(menu, &QDBusPlatformMenu::popupRequested,
            this, &QDBusPlatformMenu::popupRequested, Qt::UniqueConnection);
}